

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O0

int64_t icu_63::util64_fromDouble(double d)

{
  bool bVar1;
  UBool UVar2;
  double dVar3;
  UBool neg;
  double mant;
  int64_t result;
  double d_local;
  
  mant = 0.0;
  UVar2 = uprv_isNaN_63(d);
  if (UVar2 == '\0') {
    dVar3 = uprv_maxMantissa_63();
    if (-dVar3 <= d) {
      result = (int64_t)d;
      if (dVar3 < d) {
        result = (int64_t)dVar3;
      }
    }
    else {
      result = (int64_t)-dVar3;
    }
    bVar1 = (double)result < 0.0;
    if (bVar1) {
      result = result ^ 0x8000000000000000;
    }
    dVar3 = uprv_floor_63((double)result);
    mant = (double)(long)dVar3;
    if (bVar1) {
      mant = (double)-(long)mant;
    }
  }
  return (int64_t)mant;
}

Assistant:

int64_t util64_fromDouble(double d) {
    int64_t result = 0;
    if (!uprv_isNaN(d)) {
        double mant = uprv_maxMantissa();
        if (d < -mant) {
            d = -mant;
        } else if (d > mant) {
            d = mant;
        }
        UBool neg = d < 0; 
        if (neg) {
            d = -d;
        }
        result = (int64_t)uprv_floor(d);
        if (neg) {
            result = -result;
        }
    }
    return result;
}